

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu383.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu383_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MppDev ctx;
  long local_68;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  RK_S32 index;
  MppDev dev;
  Vdpu383Vp9dRegSet *hw_regs;
  Vdpu383Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x40);
  dev = *(MppDev *)(lVar1 + 0xf0);
  ctx = *(MppDev *)((long)hal + 0x10);
  if (*(int *)((long)hal + 0x38) != 0) {
    dev = *(MppDev *)(lVar1 + (long)(task->dec).reg_index * 0x40 + 0x30);
  }
  if ((dev == (MppDev)0x0) &&
     (_mpp_log_l(2,"hal_vp9d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_vdpu383_start",0x476), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  rd_cfg._8_8_ = (long)dev + 4;
  p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
  if (p_hal._4_4_ == MPP_OK) {
    rd_cfg._8_8_ = (long)dev + 0x60;
    p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
    if (p_hal._4_4_ == MPP_OK) {
      rd_cfg._8_8_ = (long)dev + 0xe8;
      p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
      if (p_hal._4_4_ == MPP_OK) {
        rd_cfg._8_8_ = (long)dev + 0x194;
        p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
        if (p_hal._4_4_ == MPP_OK) {
          local_68 = (long)dev + 0x20;
          rd_cfg.reg._0_4_ = 4;
          rd_cfg.reg._4_4_ = 0x3c;
          p_hal._4_4_ = mpp_dev_ioctl(ctx,5,&local_68);
          if (p_hal._4_4_ == MPP_OK) {
            vdpu383_set_rcbinfo(ctx,(Vdpu383RcbInfo *)(lVar1 + 0x174));
            p_hal._4_4_ = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
            if (p_hal._4_4_ != MPP_OK) {
              _mpp_log_l(2,"hal_vp9d_vdpu383","send cmd failed %d\n","hal_vp9d_vdpu383_start",
                         (ulong)(uint)p_hal._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"hal_vp9d_vdpu383","set register read failed %d\n","hal_vp9d_vdpu383_start"
                       ,(ulong)(uint)p_hal._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_vp9d_vdpu383","set register write failed %d\n","hal_vp9d_vdpu383_start",
                     (ulong)(uint)p_hal._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_vp9d_vdpu383","set register write failed %d\n","hal_vp9d_vdpu383_start",
                   (ulong)(uint)p_hal._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_vp9d_vdpu383","set register write failed %d\n","hal_vp9d_vdpu383_start",
                 (ulong)(uint)p_hal._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_vp9d_vdpu383","set register write failed %d\n","hal_vp9d_vdpu383_start",
               (ulong)(uint)p_hal._4_4_);
  }
  return p_hal._4_4_;
}

Assistant:

static MPP_RET hal_vp9d_vdpu383_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu383Vp9dCtx *hw_ctx = (Vdpu383Vp9dCtx*)p_hal->hw_ctx;
    Vdpu383Vp9dRegSet *hw_regs = (Vdpu383Vp9dRegSet *)hw_ctx->hw_regs;
    MppDev dev = p_hal->dev;

    if (p_hal->fast_mode) {
        RK_S32 index = task->dec.reg_index;

        hw_regs = (Vdpu383Vp9dRegSet *)hw_ctx->g_buf[index].hw_regs;
    }

    mpp_assert(hw_regs);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &hw_regs->ctrl_regs;
        wr_cfg.size = sizeof(hw_regs->ctrl_regs);
        wr_cfg.offset = OFFSET_CTRL_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->common_addr;
        wr_cfg.size = sizeof(hw_regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_paras;
        wr_cfg.size = sizeof(hw_regs->vp9d_paras);
        wr_cfg.offset = OFFSET_CODEC_PARAS_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_addrs;
        wr_cfg.size = sizeof(hw_regs->vp9d_addrs);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &hw_regs->ctrl_regs.reg15;
        rd_cfg.size = sizeof(hw_regs->ctrl_regs.reg15);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        // rcb info for sram
        vdpu383_set_rcbinfo(dev, hw_ctx->rcb_info);

        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    return ret;
}